

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# demangle.cc
# Opt level: O1

bool absl::debugging_internal::ParseBareFunctionType(State *state)

{
  ParseState *pPVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  uint uVar5;
  int iVar6;
  undefined4 uVar7;
  int iVar8;
  int iVar9;
  bool bVar10;
  bool bVar11;
  
  iVar2 = state->recursion_depth;
  iVar3 = state->steps;
  state->recursion_depth = iVar2 + 1;
  state->steps = iVar3 + 1;
  if (iVar3 < 0x20000 && iVar2 < 0x100) {
    pPVar1 = &state->parse_state;
    iVar4 = (state->parse_state).prev_name_idx;
    iVar8 = (state->parse_state).mangled_idx;
    iVar9 = (state->parse_state).out_cur_idx;
    uVar5 = *(uint *)&(state->parse_state).field_0xc;
    *(uint *)&(state->parse_state).field_0xc = uVar5 & 0x7fffffff;
    state->recursion_depth = iVar2 + 2;
    state->steps = iVar3 + 2;
    if (iVar3 < 0x1ffff && iVar2 < 0xff) {
      while( true ) {
        iVar2 = pPVar1->mangled_idx;
        iVar3 = pPVar1->out_cur_idx;
        iVar6 = (state->parse_state).prev_name_idx;
        uVar7 = *(undefined4 *)&(state->parse_state).field_0xc;
        bVar10 = ParseTwoCharToken(state,"Ua");
        if ((!bVar10) || (bVar10 = ParseName(state), !bVar10)) break;
        iVar2 = state->steps;
        state->steps = iVar2 + 1;
        if ((0x100 < state->recursion_depth) || (0x1ffff < iVar2)) goto LAB_0019253d;
      }
      pPVar1->mangled_idx = iVar2;
      pPVar1->out_cur_idx = iVar3;
      (state->parse_state).prev_name_idx = iVar6;
      *(undefined4 *)&(state->parse_state).field_0xc = uVar7;
    }
LAB_0019253d:
    state->recursion_depth = state->recursion_depth + -1;
    bVar10 = ParseType(state);
    if (bVar10) {
      do {
        bVar11 = ParseType(state);
      } while (bVar11);
      if (bVar10) {
        *(uint *)&(state->parse_state).field_0xc =
             *(uint *)&(state->parse_state).field_0xc & 0x7fffffff | uVar5 & 0x80000000;
        MaybeAppend(state,"()");
        goto LAB_0019259a;
      }
    }
    (state->parse_state).prev_name_idx = iVar4;
    pPVar1->mangled_idx = iVar8;
    pPVar1->out_cur_idx = iVar9;
    *(uint *)&(state->parse_state).field_0xc = uVar5;
  }
  else {
    bVar10 = false;
  }
LAB_0019259a:
  state->recursion_depth = state->recursion_depth + -1;
  return bVar10;
}

Assistant:

static bool ParseBareFunctionType(State *state) {
  ComplexityGuard guard(state);
  if (guard.IsTooComplex()) return false;
  ParseState copy = state->parse_state;
  DisableAppend(state);
  if (ZeroOrMore(ParseOverloadAttribute, state) &&
      OneOrMore(ParseType, state)) {
    RestoreAppend(state, copy.append);
    MaybeAppend(state, "()");
    return true;
  }
  state->parse_state = copy;
  return false;
}